

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clCreateSubDevices(cl_device_id in_device,cl_device_partition_property *properties,
                         cl_uint num_devices,cl_device_id *out_devices,cl_uint *num_devices_ret)

{
  cl_icd_dispatch *pcVar1;
  SConfig *pSVar2;
  time_point tickStart;
  CLIntercept *this;
  SConfig *pSVar3;
  SConfig *pSVar4;
  size_t *in_RCX;
  cl_bool in_EDX;
  cl_mem in_RSI;
  CLIntercept *in_RDI;
  size_t *in_R8;
  size_t *in_R9;
  cl_uint d;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  string propsStr;
  string deviceInfo;
  cl_uint local_num_devices_ret;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  size_t in_stack_fffffffffffffdc8;
  cl_bool in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  CLIntercept *in_stack_fffffffffffffdd8;
  _cl_device_id *in_stack_fffffffffffffde0;
  CObjectTracker *in_stack_fffffffffffffde8;
  allocator *paVar5;
  cl_uint in_stack_fffffffffffffdf0;
  cl_event *in_stack_fffffffffffffdf8;
  cl_event *in_stack_fffffffffffffe00;
  SConfig *in_stack_fffffffffffffe18;
  cl_uint numSubDevices;
  SConfig *in_stack_fffffffffffffe20;
  SConfig *in_stack_fffffffffffffe28;
  CLIntercept *in_stack_fffffffffffffe30;
  CLIntercept *in_stack_fffffffffffffe48;
  allocator *in_stack_fffffffffffffe50;
  cl_int errorCode;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  CLIntercept *in_stack_fffffffffffffe60;
  SConfig *in_stack_fffffffffffffe68;
  undefined1 includeId;
  undefined4 in_stack_fffffffffffffe78;
  cl_int cVar6;
  time_point in_stack_fffffffffffffe88;
  time_point in_stack_fffffffffffffe98;
  time_point in_stack_fffffffffffffea0;
  int local_13c;
  undefined8 local_138;
  undefined8 local_130;
  allocator local_121;
  string local_120 [36];
  uint local_fc;
  undefined8 local_f8;
  undefined8 local_f0;
  allocator local_e1;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  cl_device_id *in_stack_ffffffffffffff30;
  cl_uint in_stack_ffffffffffffff3c;
  CLIntercept *in_stack_ffffffffffffff40;
  int local_b4;
  undefined8 local_a8;
  undefined8 local_a0;
  string local_88 [8];
  string *in_stack_ffffffffffffff80;
  cl_device_partition_property *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  string local_68 [36];
  undefined4 local_44;
  uint64_t local_40;
  CLIntercept *local_38;
  size_t *local_30;
  size_t *local_28;
  cl_int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pcVar1 = CLIntercept::dispatch(local_38),
     pcVar1->clCreateSubDevices == (cl_api_clCreateSubDevices)0x0)) {
    local_13c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_13c);
    local_4 = -0x21;
  }
  else {
    local_40 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffdd8);
    local_44 = 0;
    if (local_30 == (size_t *)0x0) {
      local_30 = (size_t *)&local_44;
    }
    std::__cxx11::string::string(local_68);
    std::__cxx11::string::string(local_88);
    pSVar2 = CLIntercept::config(local_38);
    if ((pSVar2->CallLogging & 1U) != 0) {
      CLIntercept::getDeviceInfoString
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      CLIntercept::getDevicePartitionPropertiesString
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    pSVar2 = CLIntercept::config(local_38);
    if ((pSVar2->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffe98.__d.__r = (duration)(duration)local_38;
      in_stack_fffffffffffffea0.__d.__r = (duration)(duration)local_40;
      in_R9 = (size_t *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffdd0 = in_EDX;
      in_stack_fffffffffffffdc8 = std::__cxx11::string::c_str();
      in_EDX = in_stack_fffffffffffffdd0;
      CLIntercept::callLoggingEnter
                ((CLIntercept *)in_stack_fffffffffffffe98.__d.__r,"clCreateSubDevices",
                 (uint64_t)in_stack_fffffffffffffea0.__d.__r,(cl_kernel)0x0,
                 "in_device = %s, properties = [ %s ], num_devices = %u");
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    tickStart.__d.__r = (duration)CLIntercept::config(local_38);
    if ((((ulong)(((CLIntercept *)tickStart.__d.__r)->m_Dispatch).clCreateContextFromType & 1) != 0)
       || (in_stack_fffffffffffffe88.__d.__r = (duration)CLIntercept::config(local_38),
          (((SConfig *)in_stack_fffffffffffffe88.__d.__r)->ChromeCallLogging & 1U) != 0)) {
      local_a0 = std::chrono::_V2::steady_clock::now();
    }
    this = (CLIntercept *)CLIntercept::dispatch(local_38);
    local_b4 = (*(this->m_Dispatch).clEnqueueReadBufferRect)
                         ((cl_command_queue)in_RDI,in_RSI,in_EDX,local_28,local_30,in_R9,
                          in_stack_fffffffffffffdc8,
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (size_t)in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
                          in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00);
    cVar6 = local_b4;
    pSVar2 = CLIntercept::config(local_38);
    if (((pSVar2->HostPerformanceTiming & 1U) != 0) ||
       (in_stack_fffffffffffffe68 = CLIntercept::config(local_38),
       (in_stack_fffffffffffffe68->ChromeCallLogging & 1U) != 0)) {
      local_a8 = std::chrono::_V2::steady_clock::now();
      in_stack_fffffffffffffe60 = (CLIntercept *)CLIntercept::config(local_38);
      if ((((ulong)(in_stack_fffffffffffffe60->m_Dispatch).clCreateContextFromType & 1) != 0) &&
         (in_stack_fffffffffffffe5f =
               CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_40),
         (bool)in_stack_fffffffffffffe5f)) {
        in_stack_fffffffffffffe50 = &local_e1;
        in_stack_fffffffffffffe48 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"",in_stack_fffffffffffffe50);
        local_f0 = local_a0;
        local_f8 = local_a8;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)tickStart.__d.__r,(char *)in_stack_fffffffffffffe88.__d.__r,
                   (string *)this,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
    }
    pSVar3 = CLIntercept::config(local_38);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (in_stack_fffffffffffffe30 = (CLIntercept *)CLIntercept::config(local_38),
        ((ulong)(in_stack_fffffffffffffe30->m_Dispatch).clCreateSubDevices & 0x100000000) != 0)) &&
       (local_b4 != 0)) {
      in_stack_fffffffffffffe28 = CLIntercept::config(local_38);
      if ((in_stack_fffffffffffffe28->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_RDI,(char *)in_RSI,in_EDX);
      }
      in_stack_fffffffffffffe20 = CLIntercept::config(local_38);
      if ((in_stack_fffffffffffffe20->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      in_stack_fffffffffffffe18 = CLIntercept::config(local_38);
      if ((in_stack_fffffffffffffe18->NoErrors & 1U) != 0) {
        local_b4 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    numSubDevices = (cl_uint)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    includeId = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
    errorCode = (cl_int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    if ((((pSVar4->LeakChecking & 1U) != 0) && (local_28 != (size_t *)0x0)) &&
       (local_30 != (size_t *)0x0)) {
      local_fc = 0;
      while( true ) {
        numSubDevices = (cl_uint)((ulong)in_stack_fffffffffffffe18 >> 0x20);
        includeId = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
        errorCode = (cl_int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        if ((uint)*local_30 <= local_fc) break;
        pSVar4 = CLIntercept::config(local_38);
        if ((pSVar4->LeakChecking & 1U) != 0) {
          CLIntercept::objectTracker(local_38);
          CObjectTracker::AddAllocation<_cl_device_id*>
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        }
        local_fc = local_fc + 1;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_fffffffffffffe60,
                 (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),errorCode,
                 (cl_event *)in_stack_fffffffffffffe48,(cl_sync_point_khr *)pSVar3);
    }
    pSVar3 = CLIntercept::config(local_38);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar5 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"",paVar5);
      local_130 = local_a0;
      local_138 = local_a8;
      CLIntercept::chromeCallLoggingExit
                (this,(char *)CONCAT44(cVar6,in_stack_fffffffffffffe78),(string *)pSVar2,
                 (bool)includeId,(uint64_t)in_stack_fffffffffffffe60,tickStart,
                 in_stack_fffffffffffffe88);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    if (((local_b4 == 0) && (local_28 != (size_t *)0x0)) && (local_30 != (size_t *)0x0)) {
      CLIntercept::addSubDeviceInfo
                (in_stack_fffffffffffffe30,(cl_device_id)in_stack_fffffffffffffe28,
                 (cl_device_id *)in_stack_fffffffffffffe20,numSubDevices);
    }
    local_4 = local_b4;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clCreateSubDevices)(
    cl_device_id in_device,
    const cl_device_partition_property* properties,
    cl_uint num_devices,
    cl_device_id* out_devices,
    cl_uint* num_devices_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateSubDevices )
    {
        GET_ENQUEUE_COUNTER();

        cl_uint local_num_devices_ret = 0;
        if( num_devices_ret == NULL )
        {
            num_devices_ret = &local_num_devices_ret;
        }

        std::string deviceInfo;
        std::string propsStr;
        if( pIntercept->config().CallLogging )
        {
            pIntercept->getDeviceInfoString(
                1,
                &in_device,
                deviceInfo );
            pIntercept->getDevicePartitionPropertiesString(
                properties,
                propsStr );
        }
        CALL_LOGGING_ENTER( "in_device = %s, properties = [ %s ], num_devices = %u",
            deviceInfo.c_str(),
            propsStr.c_str(),
            num_devices );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clCreateSubDevices(
            in_device,
            properties,
            num_devices,
            out_devices,
            num_devices_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        if( pIntercept->config().LeakChecking &&
            out_devices &&
            num_devices_ret )
        {
            for( cl_uint d = 0; d < num_devices_ret[0]; d++ )
            {
                ADD_OBJECT_ALLOCATION( out_devices[d] );
            }
        }
        CALL_LOGGING_EXIT( retVal );

        if( retVal == CL_SUCCESS &&
            out_devices &&
            num_devices_ret )
        {
            pIntercept->addSubDeviceInfo(
                in_device,
                out_devices,
                num_devices_ret[0] );
        }

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_DEVICE);
}